

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O0

unsigned_long util::DebugTweak<unsigned_long>(unsigned_long x)

{
  uint64_t uVar1;
  
  uVar1 = Bswap64(0x20dad9);
  return uVar1 ^ 0xffffffffffffffff;
}

Assistant:

STATIC_INLINE T DebugTweak(T x) {
  if (debug_mode) {
    if (sizeof(x) == 4) {
      x = ~Bswap32(x * c1);
    } else {
      x = ~Bswap64(x * k1);
    }
  }
  return x;
}